

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8 * google::protobuf::io::(anonymous_namespace)::DecodeVarint64KnownSize<4ul>
                  (uint8 *buffer,uint64 *value)

{
  int offset;
  int i;
  uint64 result;
  uint64 *value_local;
  uint8 *buffer_local;
  
  result = (ulong)buffer[3] << 0x15;
  offset = 0;
  for (i = 0; (uint)i < 3; i = i + 1) {
    result = ((long)(int)(buffer[i] - 0x80) << ((byte)offset & 0x3f)) + result;
    offset = offset + 7;
  }
  *value = result;
  return buffer + 4;
}

Assistant:

const uint8* DecodeVarint64KnownSize(const uint8* buffer, uint64* value) {
  GOOGLE_DCHECK_GT(N, 0);
  uint64 result = static_cast<uint64>(buffer[N - 1]) << (7 * (N - 1));
  for (int i = 0, offset = 0; i < N - 1; i++, offset += 7) {
    result += static_cast<uint64>(buffer[i] - 0x80) << offset;
  }
  *value = result;
  return buffer + N;
}